

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode curl_multi_assign(Curl_multi *multi,curl_socket_t s,void *hashp)

{
  void *pvVar1;
  curl_socket_t local_c;
  
  if ((s != -1) &&
     (local_c = s, pvVar1 = Curl_hash_pick(&multi->sockhash,&local_c,4), pvVar1 != (void *)0x0)) {
    *(void **)((long)pvVar1 + 0x10) = hashp;
    return CURLM_OK;
  }
  return CURLM_BAD_SOCKET;
}

Assistant:

CURLMcode curl_multi_assign(struct Curl_multi *multi, curl_socket_t s,
                            void *hashp)
{
  struct Curl_sh_entry *there = NULL;

  there = sh_getentry(&multi->sockhash, s);

  if(!there)
    return CURLM_BAD_SOCKET;

  there->socketp = hashp;

  return CURLM_OK;
}